

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

void __thiscall
google::protobuf::EncodedDescriptorDatabase::~EncodedDescriptorDatabase
          (EncodedDescriptorDatabase *this)

{
  EncodedDescriptorDatabase *this_local;
  
  ~EncodedDescriptorDatabase(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

EncodedDescriptorDatabase::~EncodedDescriptorDatabase() {
  for (void* p : files_to_delete_) {
    operator delete(p);
  }
}